

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O2

contenc_writer *
new_unencoding_writer(connectdata *conn,content_encoding *handler,contenc_writer *downstream)

{
  CURLcode CVar1;
  contenc_writer *pcVar2;
  
  pcVar2 = (contenc_writer *)(*Curl_ccalloc)(1,handler->paramsize + 0x10);
  if (pcVar2 != (contenc_writer *)0x0) {
    pcVar2->handler = handler;
    pcVar2->downstream = downstream;
    CVar1 = (*handler->init_writer)(conn,pcVar2);
    if (CVar1 == CURLE_OK) {
      return pcVar2;
    }
    (*Curl_cfree)(pcVar2);
  }
  return (contenc_writer *)0x0;
}

Assistant:

static struct contenc_writer *
new_unencoding_writer(struct connectdata *conn,
                      const struct content_encoding *handler,
                      struct contenc_writer *downstream)
{
  size_t sz = offsetof(struct contenc_writer, params) + handler->paramsize;
  struct contenc_writer *writer = (struct contenc_writer *)calloc(1, sz);

  if(writer) {
    writer->handler = handler;
    writer->downstream = downstream;
    if(handler->init_writer(conn, writer)) {
      free(writer);
      writer = NULL;
    }
  }

  return writer;
}